

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O2

ModelValues<mp::pre::ValueMap<std::vector<int,_std::allocator<int>_>,_int>_> * __thiscall
mp::pre::ValuePresolverImpl::
RunPresolve<mp::pre::ModelValues<mp::pre::ValueMap<std::vector<int,std::allocator<int>>,int>>>
          (ModelValues<mp::pre::ValueMap<std::vector<int,_std::allocator<int>_>,_int>_>
           *__return_storage_ptr__,ValuePresolverImpl *this,LinkFn fn,
          ModelValues<mp::pre::ValueMap<std::vector<int,_std::allocator<int>_>,_int>_> *mv,
          ValueResolution vr)

{
  _Elt_pointer pLVar1;
  code *pcVar2;
  long *plVar3;
  undefined4 in_register_00000084;
  undefined4 in_R9D;
  LinkRange *br;
  _Elt_pointer pLVar4;
  _Elt_pointer pLVar5;
  _Map_pointer local_48;
  
  CleanUpValueNodes(this);
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>>::operator=
            ((ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>> *)
             &this->src_,
             (ModelValues<mp::pre::ValueMap<std::vector<int,_std::allocator<int>_>,_int>_> *)
             CONCAT44(in_register_00000084,vr));
  pLVar4 = (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
           super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pLVar5 = (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
           super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  local_48 = (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
             super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pLVar1 = (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
           super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  while (pLVar4 != pLVar1) {
    plVar3 = (long *)((long)&pLVar4->b_->_vptr_BasicLink + (long)&(mv->name_)._M_dataplus);
    pcVar2 = (code *)fn;
    if ((fn & 1) != 0) {
      pcVar2 = *(code **)(*plVar3 + -1 + fn);
    }
    (*pcVar2)(plVar3,pLVar4->ir_,in_R9D);
    pLVar4 = pLVar4 + 1;
    if (pLVar4 == pLVar5) {
      pLVar4 = local_48[1];
      local_48 = local_48 + 1;
      pLVar5 = pLVar4 + 0x20;
    }
  }
  ModelValues<mp::pre::ValueMap<std::vector<int,std::allocator<int>>,int>>::
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>>
            ((ModelValues<mp::pre::ValueMap<std::vector<int,std::allocator<int>>,int>> *)
             __return_storage_ptr__,&this->dest_);
  return __return_storage_ptr__;
}

Assistant:

ModelValues RunPresolve(LinkFn fn, const ModelValues& mv,
                          ValueResolution vr) const {
    CleanUpValueNodes();
    src_ = mv;
    for (const auto& br: brl_)
      (br.b_.*fn)(br.ir_, vr);
    return dest_;
  }